

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::BuildsystemFileScope::~BuildsystemFileScope(BuildsystemFileScope *this)

{
  cmFileLockPool *this_00;
  cmake *this_01;
  BuildsystemFileScope *this_local;
  
  PopFunctionBlockerBarrier(this->Makefile,(bool)(this->ReportError & 1));
  PopSnapshot(this->Makefile,(bool)(this->ReportError & 1));
  this_00 = cmGlobalGenerator::GetFileLockPool(this->GG);
  cmFileLockPool::PopFileScope(this_00);
  cmGlobalGenerator::SetCurrentMakefile(this->GG,this->CurrentMakefile);
  this_01 = cmGlobalGenerator::GetCMakeInstance(this->GG);
  cmake::SetCurrentSnapshot(this_01,&this->Snapshot);
  return;
}

Assistant:

~BuildsystemFileScope()
  {
    this->Makefile->PopFunctionBlockerBarrier(this->ReportError);
    this->Makefile->PopSnapshot(this->ReportError);
#if defined(CMAKE_BUILD_WITH_CMAKE)
    this->GG->GetFileLockPool().PopFileScope();
#endif
    this->GG->SetCurrentMakefile(this->CurrentMakefile);
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
  }